

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::optimize(xpath_ast_node *this,xpath_allocator *alloc)

{
  byte bVar1;
  xpath_ast_node *pxVar2;
  xpath_ast_node *pxVar3;
  bool bVar4;
  int i;
  byte *pbVar5;
  long lVar6;
  char_t *__dest;
  char cVar7;
  byte *pbVar8;
  ulong uVar9;
  byte bVar10;
  byte local_a8 [136];
  
  if (this->_left != (xpath_ast_node *)0x0) {
    optimize(this->_left,alloc);
  }
  if (this->_right != (xpath_ast_node *)0x0) {
    optimize(this->_right,alloc);
  }
  if (this->_next != (xpath_ast_node *)0x0) {
    optimize(this->_next,alloc);
  }
  bVar1 = this->_type;
  if ((bVar1 & 0xfe) != 0x10) goto LAB_00384143;
  pxVar2 = this->_right;
  if ((((pxVar2 != (xpath_ast_node *)0x0) && (pxVar2->_type == '\x03')) &&
      (pxVar2->_left->_type == '\x16')) && (pxVar2->_right->_rettype == '\x02')) {
    this->_right = pxVar2->_right;
  }
  pxVar2 = this->_right;
  if (pxVar2 == (xpath_ast_node *)0x0) goto LAB_00384143;
  if (this->_test != '\0') {
    __assert_fail("_test == predicate_default",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x2bd8,
                  "void pugi::impl::(anonymous namespace)::xpath_ast_node::optimize_self(xpath_allocator *)"
                 );
  }
  if (pxVar2->_type == '\x13') {
    cVar7 = '\x03';
    if (((pxVar2->_data).number != 1.0) || (NAN((pxVar2->_data).number))) goto LAB_00384124;
  }
  else {
LAB_00384124:
    cVar7 = '\x02';
    if (2 < (byte)(pxVar2->_type - 0x13U) || pxVar2->_rettype != '\x02') {
      if (pxVar2->_rettype == '\x02') goto LAB_00384143;
      bVar4 = is_posinv_expr(pxVar2);
      cVar7 = '\x01';
      if (!bVar4) goto LAB_00384143;
    }
  }
  this->_test = cVar7;
LAB_00384143:
  if (((((bVar1 == 0x38) && ((byte)this->_axis < 0xd)) &&
       (((0x1038U >> ((byte)this->_axis & 0x1f) & 1) != 0 &&
        (((pxVar2 = this->_left, pxVar2 != (xpath_ast_node *)0x0 && (pxVar2->_type == '8')) &&
         (pxVar2->_axis == '\x05')))))) &&
      ((pxVar2->_test == '\x02' && (pxVar2->_right == (xpath_ast_node *)0x0)))) &&
     (bVar4 = is_posinv_step(this), bVar4)) {
    this->_axis = (byte)(this->_axis - 3U) < 2 ^ 5;
    this->_left = this->_left->_left;
  }
  if (((this->_type != ',') || (pxVar2 = this->_right, pxVar2 == (xpath_ast_node *)0x0)) ||
     ((pxVar2->_type != '\x12' || (pxVar2->_next->_type != '\x12')))) {
LAB_003842b9:
    if (((((this->_type == '\x03') && (pxVar2 = this->_left, pxVar2 != (xpath_ast_node *)0x0)) &&
         (pxVar3 = this->_right, pxVar3 != (xpath_ast_node *)0x0)) &&
        ((pxVar2->_type == '8' && (pxVar2->_axis == '\x02')))) &&
       (((pxVar2->_test == '\x01' &&
         ((pxVar2->_left == (xpath_ast_node *)0x0 && (pxVar2->_right == (xpath_ast_node *)0x0)))) &&
        ((pxVar3->_type == '\x12' || ((pxVar3->_type == '\x14' && (pxVar3->_rettype == '\x03')))))))
       ) {
      this->_type = ';';
    }
    return;
  }
  pbVar5 = (pxVar2->_data).table;
  pbVar8 = (pxVar2->_next->_data).table;
  local_a8[0x70] = 0;
  local_a8[0x71] = 0;
  local_a8[0x72] = 0;
  local_a8[0x73] = 0;
  local_a8[0x74] = 0;
  local_a8[0x75] = 0;
  local_a8[0x76] = 0;
  local_a8[0x77] = 0;
  local_a8[0x78] = 0;
  local_a8[0x79] = 0;
  local_a8[0x7a] = 0;
  local_a8[0x7b] = 0;
  local_a8[0x7c] = 0;
  local_a8[0x7d] = 0;
  local_a8[0x7e] = 0;
  local_a8[0x7f] = 0;
  local_a8[0x60] = 0;
  local_a8[0x61] = 0;
  local_a8[0x62] = 0;
  local_a8[99] = 0;
  local_a8[100] = 0;
  local_a8[0x65] = 0;
  local_a8[0x66] = 0;
  local_a8[0x67] = 0;
  local_a8[0x68] = 0;
  local_a8[0x69] = 0;
  local_a8[0x6a] = 0;
  local_a8[0x6b] = 0;
  local_a8[0x6c] = 0;
  local_a8[0x6d] = 0;
  local_a8[0x6e] = 0;
  local_a8[0x6f] = 0;
  local_a8[0x50] = 0;
  local_a8[0x51] = 0;
  local_a8[0x52] = 0;
  local_a8[0x53] = 0;
  local_a8[0x54] = 0;
  local_a8[0x55] = 0;
  local_a8[0x56] = 0;
  local_a8[0x57] = 0;
  local_a8[0x58] = 0;
  local_a8[0x59] = 0;
  local_a8[0x5a] = 0;
  local_a8[0x5b] = 0;
  local_a8[0x5c] = 0;
  local_a8[0x5d] = 0;
  local_a8[0x5e] = 0;
  local_a8[0x5f] = 0;
  local_a8[0x40] = 0;
  local_a8[0x41] = 0;
  local_a8[0x42] = 0;
  local_a8[0x43] = 0;
  local_a8[0x44] = 0;
  local_a8[0x45] = 0;
  local_a8[0x46] = 0;
  local_a8[0x47] = 0;
  local_a8[0x48] = 0;
  local_a8[0x49] = 0;
  local_a8[0x4a] = 0;
  local_a8[0x4b] = 0;
  local_a8[0x4c] = 0;
  local_a8[0x4d] = 0;
  local_a8[0x4e] = 0;
  local_a8[0x4f] = 0;
  local_a8[0x30] = 0;
  local_a8[0x31] = 0;
  local_a8[0x32] = 0;
  local_a8[0x33] = 0;
  local_a8[0x34] = 0;
  local_a8[0x35] = 0;
  local_a8[0x36] = 0;
  local_a8[0x37] = 0;
  local_a8[0x38] = 0;
  local_a8[0x39] = 0;
  local_a8[0x3a] = 0;
  local_a8[0x3b] = 0;
  local_a8[0x3c] = 0;
  local_a8[0x3d] = 0;
  local_a8[0x3e] = 0;
  local_a8[0x3f] = 0;
  local_a8[0x20] = 0;
  local_a8[0x21] = 0;
  local_a8[0x22] = 0;
  local_a8[0x23] = 0;
  local_a8[0x24] = 0;
  local_a8[0x25] = 0;
  local_a8[0x26] = 0;
  local_a8[0x27] = 0;
  local_a8[0x28] = 0;
  local_a8[0x29] = 0;
  local_a8[0x2a] = 0;
  local_a8[0x2b] = 0;
  local_a8[0x2c] = 0;
  local_a8[0x2d] = 0;
  local_a8[0x2e] = 0;
  local_a8[0x2f] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x1c] = 0;
  local_a8[0x1d] = 0;
  local_a8[0x1e] = 0;
  local_a8[0x1f] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  __dest = (char_t *)0x0;
  while( true ) {
    uVar9 = (ulong)*pbVar5;
    if (uVar9 == 0) break;
    bVar1 = *pbVar8;
    bVar4 = -1 < (char)(*pbVar5 | bVar1);
    if (bVar4) {
      if (local_a8[uVar9] == 0) {
        bVar10 = bVar1;
        if (bVar1 == 0) {
          bVar10 = 0x80;
        }
        local_a8[uVar9] = bVar10;
      }
      pbVar5 = pbVar5 + 1;
      pbVar8 = pbVar8 + (bVar1 != 0);
    }
    if (!bVar4) goto LAB_003842ad;
  }
  lVar6 = 0;
  do {
    if (local_a8[lVar6] == 0) {
      local_a8[lVar6] = (byte)lVar6;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x80);
  __dest = (char_t *)xpath_allocator::allocate(alloc,0x80);
  if (__dest == (char_t *)0x0) {
    __dest = (char_t *)0x0;
  }
  else {
    memcpy(__dest,local_a8,0x80);
  }
LAB_003842ad:
  if (__dest != (char_t *)0x0) {
    this->_type = ':';
    (this->_data).string = __dest;
  }
  goto LAB_003842b9;
}

Assistant:

void optimize(xpath_allocator* alloc)
		{
			if (_left)
				_left->optimize(alloc);

			if (_right)
				_right->optimize(alloc);

			if (_next)
				_next->optimize(alloc);

			// coverity[var_deref_model]
			optimize_self(alloc);
		}